

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

bool __thiscall Assimp::D3MF::XmlSerializer::ReadToEndElement(XmlSerializer *this,string *closeTag)

{
  __type _Var1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *nodeName;
  string *closeTag_local;
  XmlSerializer *this_local;
  
  nodeName = closeTag;
  closeTag_local = (string *)this;
  do {
    uVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[2])();
    if ((uVar2 & 1) == 0) {
      this_00 = DefaultLogger::get();
      std::operator+(&local_a0,"unexpected EOF, expected closing <",nodeName);
      std::operator+(&local_80,&local_a0,"> tag");
      Logger::error(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      this_local._7_1_ = 0;
      break;
    }
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,(char *)CONCAT44(extraout_var,iVar3),&local_49)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_28 = &local_48;
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      this_local._7_1_ = 1;
      local_60 = 1;
    }
    else {
      iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[3])();
      if ((iVar3 == 2) && (_Var1 = std::operator==(local_28,nodeName), _Var1)) {
        this_local._7_1_ = 0;
        local_60 = 1;
      }
      else {
        local_60 = 0;
      }
    }
    std::__cxx11::string::~string((string *)&local_48);
  } while (local_60 == 0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ReadToEndElement(const std::string& closeTag) {
        while(xmlReader->read()) {
            const std::string &nodeName( xmlReader->getNodeName() );
            if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT) {
                return true;
            } else if (xmlReader->getNodeType() == irr::io::EXN_ELEMENT_END && nodeName == closeTag) {
                return false;
            }
        }
        ASSIMP_LOG_ERROR("unexpected EOF, expected closing <" + closeTag + "> tag");

        return false;
    }